

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

quint64 pseudoClass(State state)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 2;
  if (((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i & 1) != 0) {
    uVar2 = (ulong)((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                          super_QFlagsStorage<QStyle::StateFlag>.i >> 9 & 0x10) + 1;
  }
  uVar2 = ((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                 super_QFlagsStorage<QStyle::StateFlag>.i >> 5 & 0x1008 |
          (uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                super_QFlagsStorage<QStyle::StateFlag>.i & 4 |
          ((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                 super_QFlagsStorage<QStyle::StateFlag>.i & 0x10000) << 0xf) | uVar2;
  uVar1 = uVar2 | 0x2000000020;
  if (((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i & 0x20) == 0) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 | 0x4000000040;
  if (((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i & 8) == 0) {
    uVar2 = uVar1;
  }
  return ((ulong)((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                        super_QFlagsStorage<QStyle::StateFlag>.i >> 6 & 0x2000) |
         (ulong)(((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                        super_QFlagsStorage<QStyle::StateFlag>.i & 0x40024) != 0) << 0x29 |
         (ulong)(((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                        super_QFlagsStorage<QStyle::StateFlag>.i >> 6 & 0x200) +
                 ((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                        super_QFlagsStorage<QStyle::StateFlag>.i & 0x10) * 8 |
                (uint)(-1 < (char)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                                  super_QFlagsStorage<QStyle::StateFlag>.i) << 10)) + 0x20000000400
         | (ulong)(((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                          super_QFlagsStorage<QStyle::StateFlag>.i & 0x2000000) << 5 |
                  (uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                        super_QFlagsStorage<QStyle::StateFlag>.i >> 7 & 0x4000) |
         (ulong)((uint)state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                       super_QFlagsStorage<QStyle::StateFlag>.i & 0x100000) << 0x14 | uVar2;
}

Assistant:

static quint64 pseudoClass(QStyle::State state)
{
    quint64 pc = 0;
    if (state & QStyle::State_Enabled) {
        pc |= PseudoClass_Enabled;
        if (state & QStyle::State_MouseOver)
            pc |= PseudoClass_Hover;
    } else {
        pc |= PseudoClass_Disabled;
    }
    if (state & QStyle::State_Active)
        pc |= PseudoClass_Active;
    if (state & QStyle::State_Window)
        pc |= PseudoClass_Window;
    if (state & QStyle::State_Sunken)
        pc |= PseudoClass_Pressed;
    if (state & QStyle::State_HasFocus)
        pc |= PseudoClass_Focus;
    if (state & QStyle::State_On)
        pc |= (PseudoClass_On | PseudoClass_Checked);
    if (state & QStyle::State_Off)
        pc |= (PseudoClass_Off | PseudoClass_Unchecked);
    if (state & QStyle::State_NoChange)
        pc |= PseudoClass_Indeterminate;
    if (state & QStyle::State_Selected)
        pc |= PseudoClass_Selected;
    if (state & QStyle::State_Horizontal)
        pc |= PseudoClass_Horizontal;
    else
        pc |= PseudoClass_Vertical;
    if (state & (QStyle::State_Open | QStyle::State_On | QStyle::State_Sunken))
        pc |= PseudoClass_Open;
    else
        pc |= PseudoClass_Closed;
    if (state & QStyle::State_Children)
        pc |= PseudoClass_Children;
    if (state & QStyle::State_Sibling)
        pc |= PseudoClass_Sibling;
    if (state & QStyle::State_ReadOnly)
        pc |= PseudoClass_ReadOnly;
    if (state & QStyle::State_Item)
        pc |= PseudoClass_Item;
#ifdef QT_KEYPAD_NAVIGATION
    if (state & QStyle::State_HasEditFocus)
        pc |= PseudoClass_EditFocus;
#endif
    return pc;
}